

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::ImmutableMessageGenerator
          (ImmutableMessageGenerator *this,Descriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageGenerator_004d9920;
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,descriptor,this->context_);
  if ((context->options_).enforce_lite == true) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message.cc"
               ,0x60);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

ImmutableMessageGenerator::ImmutableMessageGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
}